

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O3

optional<std::pair<helics::route_id,_helics::ActionMessage>_> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (optional<std::pair<helics::route_id,_helics::ActionMessage>_> *__return_storage_ptr__,
          BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
          *this,duration<long,_std::ratio<1L,_1000L>_> timeout)

{
  cv_status cVar1;
  pair<helics::route_id,_helics::ActionMessage> *__u;
  long lVar2;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_118;
  long local_108;
  BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
  *local_100;
  undefined1 local_f8 [192];
  bool local_38;
  
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::try_pop(__return_storage_ptr__,
            (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
             *)this);
  if ((__return_storage_ptr__->
      super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_engaged
      == false) {
    local_100 = this + 0xd8;
    local_108 = timeout.__r * 1000000;
    do {
      local_118._M_owns = false;
      local_118._M_device = (mutex_type *)(this + 0x28);
      std::unique_lock<std::mutex>::lock(&local_118);
      local_118._M_owns = true;
      __u = *(pair<helics::route_id,_helics::ActionMessage> **)(this + 0x98);
      if (*(pair<helics::route_id,_helics::ActionMessage> **)(this + 0xb8) != __u) {
LAB_002c2cb0:
        std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                  ((optional<std::pair<helics::route_id,helics::ActionMessage>> *)
                   __return_storage_ptr__,__u);
        std::
        deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ::pop_front((deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                     *)(this + 0x88));
LAB_002c2cf2:
        std::unique_lock<std::mutex>::~unique_lock(&local_118);
        return __return_storage_ptr__;
      }
      lVar2 = *(long *)(this + 0x70);
      if (*(long *)(this + 0x68) != lVar2) {
LAB_002c2cc9:
        std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                  ((optional<std::pair<helics::route_id,helics::ActionMessage>> *)
                   __return_storage_ptr__,
                   (pair<helics::route_id,_helics::ActionMessage> *)(lVar2 + -0xc0));
        lVar2 = *(long *)(this + 0x70);
        *(long *)(this + 0x70) = lVar2 + -0xc0;
        helics::ActionMessage::~ActionMessage((ActionMessage *)(lVar2 + -0xb8));
        goto LAB_002c2cf2;
      }
      local_f8._0_8_ = std::chrono::_V2::steady_clock::now();
      local_f8._0_8_ = local_f8._0_8_ + local_108;
      cVar1 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((condition_variable *)local_100,&local_118,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)local_f8);
      __u = *(pair<helics::route_id,_helics::ActionMessage> **)(this + 0x98);
      if (*(pair<helics::route_id,_helics::ActionMessage> **)(this + 0xb8) != __u)
      goto LAB_002c2cb0;
      lVar2 = *(long *)(this + 0x70);
      if (*(long *)(this + 0x68) != lVar2) goto LAB_002c2cc9;
      std::unique_lock<std::mutex>::unlock(&local_118);
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_f8,
                (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                 *)this);
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::
      _M_move_assign((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     __return_storage_ptr__,
                     (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     local_f8);
      if (local_38 == true) {
        local_38 = false;
        helics::ActionMessage::~ActionMessage((ActionMessage *)(local_f8 + 8));
      }
      if (cVar1 != no_timeout) goto LAB_002c2cf2;
      std::unique_lock<std::mutex>::~unique_lock(&local_118);
    } while ((__return_storage_ptr__->
             super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>)
             ._M_payload.
             super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
             .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
             _M_engaged == false);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> pop(TIME timeout)
        {
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    val = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    break;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    val = std::move(pullElements.back());
                    pullElements.pop_back();
                    break;
                }
                auto res = condition.wait_for(pullLock, timeout);  // now wait

                if (!priorityQueue.empty()) {
                    val = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    break;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    val = std::move(pullElements.back());
                    pullElements.pop_back();
                    break;
                }
                pullLock.unlock();
                val = try_pop();
                if (res !=
                    std::cv_status::no_timeout)  // std::cv_status::no_timeout
                {
                    break;
                }
            }
            // move the value out of the optional
            return val;
        }